

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbrp_init_target(stbrp_context *context,int width,int height,stbrp_node *nodes,int num_nodes)

{
  stbrp_node *in_RCX;
  int in_EDX;
  int in_ESI;
  stbrp_context *in_RDI;
  int in_R8D;
  int i;
  int local_20;
  
  for (local_20 = 0; local_20 < in_R8D + -1; local_20 = local_20 + 1) {
    in_RCX[local_20].next = in_RCX + (local_20 + 1);
  }
  in_RCX[local_20].next = (stbrp_node *)0x0;
  in_RDI->init_mode = 1;
  in_RDI->heuristic = 0;
  in_RDI->free_head = in_RCX;
  in_RDI->active_head = in_RDI->extra;
  in_RDI->width = in_ESI;
  in_RDI->height = in_EDX;
  in_RDI->num_nodes = in_R8D;
  stbrp_setup_allow_out_of_mem(in_RDI,0);
  in_RDI->extra[0].x = 0;
  in_RDI->extra[0].y = 0;
  in_RDI->extra[0].next = in_RDI->extra + 1;
  in_RDI->extra[1].x = (stbrp_coord)in_ESI;
  in_RDI->extra[1].y = 0xffff;
  in_RDI->extra[1].next = (stbrp_node *)0x0;
  return;
}

Assistant:

STBRP_DEF void stbrp_init_target(stbrp_context *context, int width, int height, stbrp_node *nodes, int num_nodes)
{
int i;
#ifndef STBRP_LARGE_RECTS
STBRP_ASSERT(width <= 0xffff && height <= 0xffff);
#endif

for (i=0; i < num_nodes-1; ++i)
nodes[i].next = &nodes[i+1];
nodes[i].next = NULL;
context->init_mode = STBRP__INIT_skyline;
context->heuristic = STBRP_HEURISTIC_Skyline_default;
context->free_head = &nodes[0];
context->active_head = &context->extra[0];
context->width = width;
context->height = height;
context->num_nodes = num_nodes;
stbrp_setup_allow_out_of_mem(context, 0);

/*  node 0 is the full width, node 1 is the sentinel (lets us not store width explicitly) */
context->extra[0].x = 0;
context->extra[0].y = 0;
context->extra[0].next = &context->extra[1];
context->extra[1].x = (stbrp_coord) width;
#ifdef STBRP_LARGE_RECTS
context->extra[1].y = (1<<30);
#else
context->extra[1].y = 65535;
#endif
context->extra[1].next = NULL;
}